

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O0

pair<double,_double> __thiscall
ear::ScreenEdgeLockHandler::handleAzimuthElevation
          (ScreenEdgeLockHandler *this,double azimuth,double elevation,
          ScreenEdgeLock *screenEdgeLock)

{
  bool bVar1;
  not_implemented *this_00;
  pair<double,_double> pVar2;
  allocator<char> local_69;
  string local_68;
  ScreenEdgeLock *local_48;
  ScreenEdgeLock *screenEdgeLock_local;
  double elevation_local;
  double azimuth_local;
  ScreenEdgeLockHandler *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ScreenEdgeLock *local_10;
  
  local_48 = screenEdgeLock;
  screenEdgeLock_local = (ScreenEdgeLock *)elevation;
  elevation_local = azimuth;
  azimuth_local = (double)this;
  local_10 = screenEdgeLock;
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!(&screenEdgeLock->horizontal);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_18 = &screenEdgeLock->vertical;
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pVar2 = std::make_pair<double&,double&>(&elevation_local,(double *)&screenEdgeLock_local);
      return pVar2;
    }
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"screenEdgeLock",&local_69)
  ;
  not_implemented::not_implemented(this_00,&local_68);
  __cxa_throw(this_00,&not_implemented::typeinfo,not_implemented::~not_implemented);
}

Assistant:

std::pair<double, double> handleAzimuthElevation(
        double azimuth, double elevation, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_pair(azimuth, elevation);
    }